

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4447fb::FloatExpr<float>::printLeft(FloatExpr<float> *this,OutputStream *s)

{
  int iVar1;
  char *pcVar2;
  int local_90;
  int local_8c;
  StringView local_80;
  int local_6c;
  char local_68 [4];
  int n;
  char num [24];
  uint d0;
  uint d1;
  char *e;
  char *t;
  undefined8 uStack_30;
  anon_union_4_2_325080ff anon_var_0;
  size_t N;
  char *last;
  char *first;
  OutputStream *s_local;
  FloatExpr<float> *this_local;
  
  first = (char *)s;
  s_local = (OutputStream *)this;
  last = StringView::begin(&this->Contents);
  pcVar2 = StringView::end(&this->Contents);
  uStack_30 = 8;
  if ((char *)0x8 < pcVar2 + (1 - (long)last)) {
    N = (size_t)(last + 8);
    _d0 = (char *)((long)&t + 4);
    for (e = last; e != (char *)N; e = e + 2) {
      iVar1 = isdigit((int)*e);
      if (iVar1 == 0) {
        local_8c = *e + -0x57;
      }
      else {
        local_8c = *e + -0x30;
      }
      num[0x14] = (undefined1)local_8c;
      num[0x15] = local_8c._1_1_;
      num[0x16] = local_8c._2_1_;
      num[0x17] = local_8c._3_1_;
      pcVar2 = e + 1;
      iVar1 = isdigit((int)*pcVar2);
      if (iVar1 == 0) {
        local_90 = *pcVar2 + -0x57;
      }
      else {
        local_90 = *pcVar2 + -0x30;
      }
      num[0x10] = (undefined1)local_90;
      num[0x11] = local_90._1_1_;
      num[0x12] = local_90._2_1_;
      num[0x13] = local_90._3_1_;
      *_d0 = (char)(num._20_4_ << 4) + (char)local_90;
      _d0 = _d0 + 1;
    }
    std::reverse<char*>((char *)((long)&t + 4),_d0);
    memset(local_68,0,0x18);
    local_6c = snprintf(local_68,0x18,"%af",(double)t._4_4_);
    StringView::StringView(&local_80,local_68,local_68 + local_6c);
    OutputStream::operator+=((OutputStream *)first,local_80);
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    const char *first = Contents.begin();
    const char *last = Contents.end() + 1;

    const size_t N = FloatData<Float>::mangled_size;
    if (static_cast<std::size_t>(last - first) > N) {
      last = first + N;
      union {
        Float value;
        char buf[sizeof(Float)];
      };
      const char *t = first;
      char *e = buf;
      for (; t != last; ++t, ++e) {
        unsigned d1 = isdigit(*t) ? static_cast<unsigned>(*t - '0')
                                  : static_cast<unsigned>(*t - 'a' + 10);
        ++t;
        unsigned d0 = isdigit(*t) ? static_cast<unsigned>(*t - '0')
                                  : static_cast<unsigned>(*t - 'a' + 10);
        *e = static_cast<char>((d1 << 4) + d0);
      }
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
      std::reverse(buf, e);
#endif
      char num[FloatData<Float>::max_demangled_size] = {0};
      int n = snprintf(num, sizeof(num), FloatData<Float>::spec, value);
      s += StringView(num, num + n);
    }
  }